

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *_bias,Option *opt)

{
  float *pfVar1;
  int _c;
  int *piVar2;
  void *pvVar3;
  size_t sVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ulong uVar11;
  undefined8 *puVar12;
  float *pfVar13;
  long lVar14;
  long lVar15;
  void *pvVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  void *pvVar24;
  undefined8 *puVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  void *pvVar31;
  long lVar32;
  uint uVar33;
  void *pvVar34;
  void *pvVar35;
  void *pvVar36;
  ulong uVar37;
  long lVar38;
  void *pvVar39;
  void *pvVar40;
  uint uVar41;
  undefined8 *puVar42;
  undefined8 *puVar43;
  uint uVar44;
  void *pvVar45;
  long lVar46;
  uint uVar47;
  ulong uVar48;
  long lVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  void *local_390;
  float d1 [4];
  undefined4 local_378;
  undefined4 uStack_374;
  Allocator *local_368;
  int iStack_35c;
  int local_358;
  size_t local_348;
  int tiles;
  int nRowBlocks;
  void *local_330;
  void *local_328;
  void *local_318;
  int nColBlocks;
  void *local_300;
  void *local_2f8;
  void *local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  void *local_2c8;
  Mat top_blob_tm;
  undefined1 local_268 [8];
  undefined4 uStack_260;
  float fStack_25c;
  undefined4 local_258;
  undefined4 uStack_254;
  int local_250;
  Allocator *local_248;
  int iStack_240;
  int iStack_23c;
  int iStack_238;
  int iStack_234;
  int local_230;
  size_t local_228;
  Mat local_218;
  ulong local_1d0;
  ulong local_1c8;
  size_t local_1c0;
  size_t local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  uint local_1a0;
  int local_19c;
  Mat *local_198;
  ulong local_190;
  float d3 [4];
  float d2 [4];
  float sum3 [16];
  Option opt_b;
  
  uVar44 = bottom_blob->c;
  uVar18 = top_blob->w;
  local_1a8 = (ulong)uVar18;
  uVar19 = top_blob->h;
  local_1c8 = (ulong)uVar19;
  _c = top_blob->c;
  uVar11 = (ulong)_c;
  local_218.data = bottom_blob->data;
  piVar2 = bottom_blob->refcount;
  local_218.refcount._0_4_ = SUB84(piVar2,0);
  local_218.refcount._4_4_ = (undefined4)((ulong)piVar2 >> 0x20);
  local_218.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  local_218.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_218.elempack = bottom_blob->elempack;
  local_218.allocator = bottom_blob->allocator;
  local_218.dims = bottom_blob->dims;
  local_218.w = bottom_blob->w;
  local_218.h = bottom_blob->h;
  local_218.d = bottom_blob->d;
  local_218.cstep = bottom_blob->cstep;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  uVar47 = (uVar18 - ((int)(uVar18 + 1) >> 0x1f)) + 1;
  uVar18 = uVar47 & 0xfffffffe;
  uVar41 = (uVar19 - ((int)(uVar19 + 1) >> 0x1f)) + 1;
  local_1a0 = uVar41 & 0xfffffffe;
  iVar23 = uVar18 + 2;
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
  opt_b.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
  opt_b.openmp_blocktime = opt->openmp_blocktime;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_bf16_storage = opt->use_bf16_storage;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_packed = opt->use_int8_packed;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b.use_shader_pack8 = opt->use_shader_pack8;
  opt_b.use_subgroup_basic = opt->use_subgroup_basic;
  opt_b.use_subgroup_vote = opt->use_subgroup_vote;
  opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt_b.use_image_storage = opt->use_image_storage;
  opt_b.use_tensor_storage = opt->use_tensor_storage;
  opt_b.use_weight_fp16_storage = opt->use_weight_fp16_storage;
  opt_b.flush_denormals = opt->flush_denormals;
  opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt_b.use_reserved_1 = opt->use_reserved_1;
  opt_b.use_reserved_2 = opt->use_reserved_2;
  opt_b.use_reserved_3 = opt->use_reserved_3;
  opt_b.use_reserved_4 = opt->use_reserved_4;
  opt_b.use_reserved_5 = opt->use_reserved_5;
  opt_b.use_reserved_6 = opt->use_reserved_6;
  opt_b.use_reserved_7 = opt->use_reserved_7;
  opt_b.use_reserved_8 = opt->use_reserved_8;
  opt_b.use_reserved_9 = opt->use_reserved_9;
  opt_b.use_reserved_10 = opt->use_reserved_10;
  opt_b.use_reserved_11 = opt->use_reserved_11;
  opt_b.blob_allocator = opt->workspace_allocator;
  local_218.c = uVar44;
  local_198 = kernel_tm;
  copy_make_border(bottom_blob,&local_218,0,(local_1a0 - bottom_blob->h) + 2,0,
                   iVar23 - bottom_blob->w,0,0.0,&opt_b);
  uVar47 = (int)uVar47 >> 1;
  uVar41 = (int)uVar41 >> 1;
  pvVar3 = _bias->data;
  local_228 = 0;
  local_268 = (undefined1  [8])0x0;
  uStack_260 = 0.0;
  fStack_25c = 0.0;
  local_258 = 0;
  uStack_254 = 0;
  local_250 = 0;
  local_248 = (Allocator *)0x0;
  iStack_240 = 0;
  iStack_23c = 0;
  iStack_238 = 0;
  iStack_234 = 0;
  local_230 = 0;
  uVar19 = uVar41 * uVar47;
  Mat::create((Mat *)local_268,0x10,uVar19,uVar44,4,opt->workspace_allocator);
  uVar17 = (ulong)uVar44;
  if (0 < (int)uVar44) {
    lVar27 = (long)iVar23;
    uVar33 = 1;
    if (1 < (int)uVar47) {
      uVar33 = uVar47;
    }
    uVar30 = 1;
    if (1 < (int)uVar41) {
      uVar30 = (ulong)uVar41;
    }
    uVar37 = 0;
    do {
      if (0 < (int)local_1c8) {
        pvVar45 = (void *)(local_228 * CONCAT44(uStack_254,local_258) * uVar37 + (long)local_268);
        uVar48 = 0;
        do {
          if (0 < (int)local_1a8) {
            puVar42 = (undefined8 *)
                      ((long)local_218.data +
                      (long)(iVar23 * 2 * (int)uVar48) * 4 +
                      local_218.cstep *
                      CONCAT44(local_218.elemsize._4_4_,(undefined4)local_218.elemsize) * uVar37);
            puVar43 = (undefined8 *)((long)puVar42 + lVar27 * 4);
            puVar25 = (undefined8 *)(lVar27 * 4 + (long)puVar43);
            puVar12 = (undefined8 *)(lVar27 * 4 + (long)puVar25);
            uVar20 = 0;
            do {
              top_blob_tm.refcount._0_4_ = (float)puVar42[1];
              top_blob_tm.refcount._4_4_ = (float)((ulong)puVar42[1] >> 0x20);
              d1[2] = (float)puVar43[1];
              d1[3] = (float)((ulong)puVar43[1] >> 0x20);
              top_blob_tm.data._0_4_ = (float)*puVar42;
              top_blob_tm.data._4_4_ = (float)((ulong)*puVar42 >> 0x20);
              d2[0] = (float)*puVar25;
              d2[1] = (float)((ulong)*puVar25 >> 0x20);
              d2[2] = (float)puVar25[1];
              d2[3] = (float)((ulong)puVar25[1] >> 0x20);
              fVar53 = top_blob_tm.data._4_4_ - d2[1];
              fVar54 = top_blob_tm.refcount._0_4_ - d2[2];
              fVar55 = top_blob_tm.refcount._4_4_ - d2[3];
              d1[0] = (float)*puVar43;
              d1[1] = (float)((ulong)*puVar43 >> 0x20);
              fVar50 = d1[1] + d2[1];
              fVar51 = d1[2] + d2[2];
              fVar52 = d1[3] + d2[3];
              fVar56 = d2[1] - d1[1];
              fVar57 = d2[2] - d1[2];
              fVar58 = d2[3] - d1[3];
              d3[0] = (float)*puVar12;
              d3[1] = (float)((ulong)*puVar12 >> 0x20);
              d3[2] = (float)puVar12[1];
              d3[3] = (float)((ulong)puVar12[1] >> 0x20);
              fVar63 = d3[1] - d1[1];
              fVar64 = d3[2] - d1[2];
              fVar65 = d3[3] - d1[3];
              top_blob_tm.data =
                   (void *)CONCAT44((d1[0] + d2[0]) - fVar51,
                                    (top_blob_tm.data._0_4_ - d2[0]) - fVar54);
              top_blob_tm.refcount._0_4_ = (d2[0] - d1[0]) - fVar57;
              top_blob_tm.refcount._4_4_ = (d3[0] - d1[0]) - fVar64;
              d1[1] = fVar50 + fVar51;
              d1[0] = fVar53 + fVar54;
              d1[2] = fVar56 + fVar57;
              d1[3] = fVar63 + fVar64;
              d2[1] = fVar51 - fVar50;
              d2[0] = fVar54 - fVar53;
              d2[3] = fVar64 - fVar63;
              d2[2] = fVar57 - fVar56;
              d3[1] = fVar52 - fVar50;
              d3[0] = fVar55 - fVar53;
              d3[3] = fVar65 - fVar63;
              d3[2] = fVar58 - fVar56;
              lVar14 = 0;
              do {
                *(undefined4 *)((long)pvVar45 + lVar14) =
                     *(undefined4 *)((long)&top_blob_tm.data + lVar14);
                *(undefined4 *)((long)pvVar45 + lVar14 + 0x10) = *(undefined4 *)((long)d1 + lVar14);
                *(undefined4 *)((long)pvVar45 + lVar14 + 0x20) = *(undefined4 *)((long)d2 + lVar14);
                *(undefined4 *)((long)pvVar45 + lVar14 + 0x30) = *(undefined4 *)((long)d3 + lVar14);
                lVar14 = lVar14 + 4;
              } while (lVar14 != 0x10);
              puVar42 = puVar42 + 1;
              puVar43 = puVar43 + 1;
              puVar25 = puVar25 + 1;
              puVar12 = puVar12 + 1;
              pvVar45 = (void *)((long)pvVar45 + 0x40);
              uVar20 = uVar20 + 1;
            } while (uVar20 != uVar33);
          }
          uVar48 = uVar48 + 1;
        } while (uVar48 != uVar30);
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 != uVar17);
  }
  top_blob_tm.cstep = 0;
  top_blob_tm.data = (void *)0x0;
  top_blob_tm.refcount._0_4_ = 0.0;
  top_blob_tm.refcount._4_4_ = 0.0;
  top_blob_tm.elemsize._0_4_ = 0;
  top_blob_tm.elemsize._4_4_ = 0;
  top_blob_tm.elempack = 0;
  top_blob_tm.allocator = (Allocator *)0x0;
  top_blob_tm.dims = 0;
  top_blob_tm.w = 0;
  top_blob_tm.h = 0;
  top_blob_tm.d = 0;
  top_blob_tm.c = 0;
  piVar2 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
  local_1b0 = uVar17;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_218.allocator == (Allocator *)0x0) {
        if (local_218.data != (void *)0x0) {
          free(local_218.data);
        }
      }
      else {
        (*(local_218.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar2 = (int *)CONCAT44(top_blob_tm.refcount._4_4_,top_blob_tm.refcount._0_4_);
  local_218.data = top_blob_tm.data;
  local_218.refcount._0_4_ = top_blob_tm.refcount._0_4_;
  local_218.refcount._4_4_ = top_blob_tm.refcount._4_4_;
  local_218.elemsize._0_4_ = (undefined4)top_blob_tm.elemsize;
  local_218.elemsize._4_4_ = top_blob_tm.elemsize._4_4_;
  local_218.elempack = top_blob_tm.elempack;
  local_218.allocator = top_blob_tm.allocator;
  local_218.w = top_blob_tm.w;
  local_218.dims = top_blob_tm.dims;
  local_218.d = top_blob_tm.d;
  local_218.h = top_blob_tm.h;
  local_218.c = top_blob_tm.c;
  local_218.cstep = top_blob_tm.cstep;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (top_blob_tm.allocator == (Allocator *)0x0) {
        if (top_blob_tm.data != (void *)0x0) {
          free(top_blob_tm.data);
        }
      }
      else {
        (*(top_blob_tm.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  top_blob_tm.cstep = 0;
  top_blob_tm.data = (void *)0x0;
  top_blob_tm.refcount._0_4_ = 0.0;
  top_blob_tm.refcount._4_4_ = 0.0;
  top_blob_tm.elemsize._0_4_ = 0;
  top_blob_tm.elemsize._4_4_ = 0;
  top_blob_tm.elempack = 0;
  top_blob_tm.allocator = (Allocator *)0x0;
  top_blob_tm.dims = 0;
  top_blob_tm.w = 0;
  top_blob_tm.h = 0;
  top_blob_tm.d = 0;
  top_blob_tm.c = 0;
  Mat::create(&top_blob_tm,0x10,uVar19,_c,4,opt->workspace_allocator);
  local_1d0 = uVar11 & 0xfffffffffffffffc;
  local_190 = (ulong)uVar19;
  if (0 < _c >> 2) {
    local_19c = top_blob_tm.dims;
    lVar21 = top_blob_tm.cstep *
             CONCAT44(top_blob_tm.elemsize._4_4_,(undefined4)top_blob_tm.elemsize);
    local_318 = local_198->data;
    local_1b8 = local_198->elemsize;
    local_1c0 = local_198->cstep;
    iVar23 = local_198->w;
    local_2d0 = (long)local_318 + 0xc0;
    lVar14 = local_1c0 * local_1b8;
    lVar27 = lVar14 * 4;
    lVar38 = local_1b8 * (long)iVar23;
    local_2d8 = (long)local_318 + lVar14 + 0xc0;
    lVar28 = (long)top_blob_tm.w *
             CONCAT44(top_blob_tm.elemsize._4_4_,(undefined4)top_blob_tm.elemsize);
    local_2e0 = (long)local_318 + lVar14 * 2 + 0xc0;
    local_2e8 = (long)local_318 + lVar14 * 3 + 0xc0;
    lVar14 = lVar38 * 4;
    uVar30 = 0;
    local_300 = local_318;
    local_2f8 = local_318;
    local_2f0 = local_318;
    do {
      pvVar31 = (void *)(uVar30 * 4 * lVar21 + (long)top_blob_tm.data);
      pvVar35 = (void *)((uVar30 * 4 + 1) * lVar21 + (long)top_blob_tm.data);
      pvVar45 = (void *)((uVar30 * 4 + 2) * lVar21 + (long)top_blob_tm.data);
      pvVar34 = (void *)((uVar30 * 4 + 3) * lVar21 + (long)top_blob_tm.data);
      if (0 < (int)uVar19) {
        local_390 = (void *)0x0;
        do {
          uVar37 = 0;
          d1[0] = 0.0;
          d1[1] = 0.0;
          d1[2] = 0.0;
          d1[3] = 0.0;
          d2[0] = 0.0;
          d2[1] = 0.0;
          d2[2] = 0.0;
          d2[3] = 0.0;
          d3[0] = 0.0;
          d3[1] = 0.0;
          d3[2] = 0.0;
          d3[3] = 0.0;
          sum3[0xc] = 0.0;
          sum3[0xd] = 0.0;
          sum3[0xe] = 0.0;
          sum3[0xf] = 0.0;
          sum3[8] = 0.0;
          sum3[9] = 0.0;
          sum3[10] = 0.0;
          sum3[0xb] = 0.0;
          sum3[4] = 0.0;
          sum3[5] = 0.0;
          sum3[6] = 0.0;
          sum3[7] = 0.0;
          sum3[0] = 0.0;
          sum3[1] = 0.0;
          sum3[2] = 0.0;
          sum3[3] = 0.0;
          if (3 < (int)uVar44) {
            lVar29 = CONCAT44(uStack_254,local_258);
            lVar15 = (long)iStack_23c * (long)local_390;
            pvVar16 = (void *)(lVar15 * lVar29 + (long)local_268);
            lVar32 = local_228 * lVar29 * 4;
            pvVar36 = (void *)((local_228 + lVar15) * lVar29 + (long)local_268);
            pvVar39 = (void *)((lVar15 + local_228 * 2) * lVar29 + (long)local_268);
            pvVar24 = (void *)((local_228 * 3 + lVar15) * lVar29 + (long)local_268);
            lVar29 = local_2e8;
            uVar48 = 0;
            lVar15 = local_2e0;
            lVar46 = local_2d8;
            lVar49 = local_2d0;
            do {
              lVar22 = 0;
              do {
                pfVar13 = (float *)((long)pvVar16 + lVar22);
                fVar50 = *pfVar13;
                fVar51 = pfVar13[1];
                fVar52 = pfVar13[2];
                fVar53 = pfVar13[3];
                pfVar13 = (float *)(lVar49 + -0xc0 + lVar22);
                fVar59 = *pfVar13 * fVar50 + *(float *)((long)d1 + lVar22);
                fVar60 = pfVar13[1] * fVar51 + *(float *)((long)d1 + lVar22 + 4);
                fVar61 = pfVar13[2] * fVar52 + *(float *)((long)d1 + lVar22 + 8);
                fVar62 = pfVar13[3] * fVar53 + *(float *)((long)d1 + lVar22 + 0xc);
                *(float *)((long)d1 + lVar22) = fVar59;
                *(float *)((long)d1 + lVar22 + 4) = fVar60;
                *(float *)((long)d1 + lVar22 + 8) = fVar61;
                *(float *)((long)d1 + lVar22 + 0xc) = fVar62;
                pfVar13 = (float *)((long)pvVar36 + lVar22);
                fVar54 = *pfVar13;
                fVar55 = pfVar13[1];
                fVar56 = pfVar13[2];
                fVar57 = pfVar13[3];
                pfVar13 = (float *)(lVar49 + -0x80 + lVar22);
                fVar59 = *pfVar13 * fVar54 + fVar59;
                fVar60 = pfVar13[1] * fVar55 + fVar60;
                fVar61 = pfVar13[2] * fVar56 + fVar61;
                fVar62 = pfVar13[3] * fVar57 + fVar62;
                *(float *)((long)d1 + lVar22) = fVar59;
                *(float *)((long)d1 + lVar22 + 4) = fVar60;
                *(float *)((long)d1 + lVar22 + 8) = fVar61;
                *(float *)((long)d1 + lVar22 + 0xc) = fVar62;
                pfVar13 = (float *)((long)pvVar39 + lVar22);
                fVar58 = *pfVar13;
                fVar63 = pfVar13[1];
                fVar64 = pfVar13[2];
                fVar65 = pfVar13[3];
                pfVar13 = (float *)(lVar49 + -0x40 + lVar22);
                fVar59 = *pfVar13 * fVar58 + fVar59;
                fVar60 = pfVar13[1] * fVar63 + fVar60;
                fVar61 = pfVar13[2] * fVar64 + fVar61;
                fVar62 = pfVar13[3] * fVar65 + fVar62;
                *(float *)((long)d1 + lVar22) = fVar59;
                *(float *)((long)d1 + lVar22 + 4) = fVar60;
                *(float *)((long)d1 + lVar22 + 8) = fVar61;
                *(float *)((long)d1 + lVar22 + 0xc) = fVar62;
                pfVar13 = (float *)((long)pvVar24 + lVar22);
                fVar5 = *pfVar13;
                fVar6 = pfVar13[1];
                fVar7 = pfVar13[2];
                fVar8 = pfVar13[3];
                pfVar13 = (float *)(lVar49 + lVar22);
                fVar66 = pfVar13[1];
                fVar67 = pfVar13[2];
                fVar68 = pfVar13[3];
                *(float *)((long)d1 + lVar22) = *pfVar13 * fVar5 + fVar59;
                *(float *)((long)d1 + lVar22 + 4) = fVar66 * fVar6 + fVar60;
                *(float *)((long)d1 + lVar22 + 8) = fVar67 * fVar7 + fVar61;
                *(float *)((long)d1 + lVar22 + 0xc) = fVar68 * fVar8 + fVar62;
                pfVar13 = (float *)(lVar46 + -0xc0 + lVar22);
                fVar59 = *pfVar13 * fVar50 + *(float *)((long)d2 + lVar22);
                fVar60 = pfVar13[1] * fVar51 + *(float *)((long)d2 + lVar22 + 4);
                fVar61 = pfVar13[2] * fVar52 + *(float *)((long)d2 + lVar22 + 8);
                fVar62 = pfVar13[3] * fVar53 + *(float *)((long)d2 + lVar22 + 0xc);
                *(float *)((long)d2 + lVar22) = fVar59;
                *(float *)((long)d2 + lVar22 + 4) = fVar60;
                *(float *)((long)d2 + lVar22 + 8) = fVar61;
                *(float *)((long)d2 + lVar22 + 0xc) = fVar62;
                pfVar13 = (float *)(lVar46 + -0x80 + lVar22);
                fVar59 = *pfVar13 * fVar54 + fVar59;
                fVar60 = pfVar13[1] * fVar55 + fVar60;
                fVar61 = pfVar13[2] * fVar56 + fVar61;
                fVar62 = pfVar13[3] * fVar57 + fVar62;
                *(float *)((long)d2 + lVar22) = fVar59;
                *(float *)((long)d2 + lVar22 + 4) = fVar60;
                *(float *)((long)d2 + lVar22 + 8) = fVar61;
                *(float *)((long)d2 + lVar22 + 0xc) = fVar62;
                pfVar13 = (float *)(lVar46 + -0x40 + lVar22);
                fVar59 = *pfVar13 * fVar58 + fVar59;
                fVar60 = pfVar13[1] * fVar63 + fVar60;
                fVar61 = pfVar13[2] * fVar64 + fVar61;
                fVar62 = pfVar13[3] * fVar65 + fVar62;
                *(float *)((long)d2 + lVar22) = fVar59;
                *(float *)((long)d2 + lVar22 + 4) = fVar60;
                *(float *)((long)d2 + lVar22 + 8) = fVar61;
                *(float *)((long)d2 + lVar22 + 0xc) = fVar62;
                pfVar13 = (float *)(lVar46 + lVar22);
                fVar66 = pfVar13[1];
                fVar67 = pfVar13[2];
                fVar68 = pfVar13[3];
                *(float *)((long)d2 + lVar22) = *pfVar13 * fVar5 + fVar59;
                *(float *)((long)d2 + lVar22 + 4) = fVar66 * fVar6 + fVar60;
                *(float *)((long)d2 + lVar22 + 8) = fVar67 * fVar7 + fVar61;
                *(float *)((long)d2 + lVar22 + 0xc) = fVar68 * fVar8 + fVar62;
                pfVar13 = (float *)(lVar15 + -0xc0 + lVar22);
                fVar59 = *pfVar13 * fVar50 + *(float *)((long)d3 + lVar22);
                fVar60 = pfVar13[1] * fVar51 + *(float *)((long)d3 + lVar22 + 4);
                fVar61 = pfVar13[2] * fVar52 + *(float *)((long)d3 + lVar22 + 8);
                fVar62 = pfVar13[3] * fVar53 + *(float *)((long)d3 + lVar22 + 0xc);
                *(float *)((long)d3 + lVar22) = fVar59;
                *(float *)((long)d3 + lVar22 + 4) = fVar60;
                *(float *)((long)d3 + lVar22 + 8) = fVar61;
                *(float *)((long)d3 + lVar22 + 0xc) = fVar62;
                pfVar13 = (float *)(lVar15 + -0x80 + lVar22);
                fVar59 = *pfVar13 * fVar54 + fVar59;
                fVar60 = pfVar13[1] * fVar55 + fVar60;
                fVar61 = pfVar13[2] * fVar56 + fVar61;
                fVar62 = pfVar13[3] * fVar57 + fVar62;
                *(float *)((long)d3 + lVar22) = fVar59;
                *(float *)((long)d3 + lVar22 + 4) = fVar60;
                *(float *)((long)d3 + lVar22 + 8) = fVar61;
                *(float *)((long)d3 + lVar22 + 0xc) = fVar62;
                pfVar13 = (float *)(lVar15 + -0x40 + lVar22);
                fVar59 = *pfVar13 * fVar58 + fVar59;
                fVar60 = pfVar13[1] * fVar63 + fVar60;
                fVar61 = pfVar13[2] * fVar64 + fVar61;
                fVar62 = pfVar13[3] * fVar65 + fVar62;
                *(float *)((long)d3 + lVar22) = fVar59;
                *(float *)((long)d3 + lVar22 + 4) = fVar60;
                *(float *)((long)d3 + lVar22 + 8) = fVar61;
                *(float *)((long)d3 + lVar22 + 0xc) = fVar62;
                pfVar13 = (float *)(lVar15 + lVar22);
                fVar66 = pfVar13[1];
                fVar67 = pfVar13[2];
                fVar68 = pfVar13[3];
                *(float *)((long)d3 + lVar22) = *pfVar13 * fVar5 + fVar59;
                *(float *)((long)d3 + lVar22 + 4) = fVar66 * fVar6 + fVar60;
                *(float *)((long)d3 + lVar22 + 8) = fVar67 * fVar7 + fVar61;
                *(float *)((long)d3 + lVar22 + 0xc) = fVar68 * fVar8 + fVar62;
                pfVar13 = (float *)(lVar29 + -0xc0 + lVar22);
                fVar66 = *pfVar13 * fVar50 + *(float *)((long)sum3 + lVar22);
                fVar67 = pfVar13[1] * fVar51 + *(float *)((long)sum3 + lVar22 + 4);
                fVar68 = pfVar13[2] * fVar52 + *(float *)((long)sum3 + lVar22 + 8);
                fVar53 = pfVar13[3] * fVar53 + *(float *)((long)sum3 + lVar22 + 0xc);
                *(float *)((long)sum3 + lVar22) = fVar66;
                *(float *)((long)sum3 + lVar22 + 4) = fVar67;
                *(float *)((long)sum3 + lVar22 + 8) = fVar68;
                *(float *)((long)sum3 + lVar22 + 0xc) = fVar53;
                pfVar13 = (float *)(lVar29 + -0x80 + lVar22);
                fVar66 = *pfVar13 * fVar54 + fVar66;
                fVar67 = pfVar13[1] * fVar55 + fVar67;
                fVar68 = pfVar13[2] * fVar56 + fVar68;
                fVar53 = pfVar13[3] * fVar57 + fVar53;
                *(float *)((long)sum3 + lVar22) = fVar66;
                *(float *)((long)sum3 + lVar22 + 4) = fVar67;
                *(float *)((long)sum3 + lVar22 + 8) = fVar68;
                *(float *)((long)sum3 + lVar22 + 0xc) = fVar53;
                pfVar13 = (float *)(lVar29 + -0x40 + lVar22);
                fVar66 = *pfVar13 * fVar58 + fVar66;
                fVar67 = pfVar13[1] * fVar63 + fVar67;
                fVar68 = pfVar13[2] * fVar64 + fVar68;
                fVar53 = pfVar13[3] * fVar65 + fVar53;
                *(float *)((long)sum3 + lVar22) = fVar66;
                *(float *)((long)sum3 + lVar22 + 4) = fVar67;
                *(float *)((long)sum3 + lVar22 + 8) = fVar68;
                *(float *)((long)sum3 + lVar22 + 0xc) = fVar53;
                pfVar13 = (float *)(lVar29 + lVar22);
                fVar50 = pfVar13[1];
                fVar51 = pfVar13[2];
                fVar52 = pfVar13[3];
                *(float *)((long)sum3 + lVar22) = *pfVar13 * fVar5 + fVar66;
                *(float *)((long)sum3 + lVar22 + 4) = fVar50 * fVar6 + fVar67;
                *(float *)((long)sum3 + lVar22 + 8) = fVar51 * fVar7 + fVar68;
                *(float *)((long)sum3 + lVar22 + 0xc) = fVar52 * fVar8 + fVar53;
                lVar22 = lVar22 + 0x10;
              } while (lVar22 != 0x40);
              uVar37 = uVar48 + 4;
              lVar22 = uVar48 + 7;
              pvVar16 = (void *)((long)pvVar16 + lVar32);
              lVar49 = lVar49 + lVar14;
              pvVar36 = (void *)((long)pvVar36 + lVar32);
              pvVar39 = (void *)((long)pvVar39 + lVar32);
              pvVar24 = (void *)((long)pvVar24 + lVar32);
              lVar46 = lVar46 + lVar14;
              lVar15 = lVar15 + lVar14;
              lVar29 = lVar29 + lVar14;
              uVar17 = local_1b0;
              uVar48 = uVar37;
            } while (lVar22 < (int)uVar44);
          }
          if ((int)uVar37 < (int)uVar17) {
            uVar37 = uVar37 & 0xffffffff;
            pvVar24 = (void *)((local_228 * uVar37 + (long)iStack_23c * (long)local_390) *
                               CONCAT44(uStack_254,local_258) + (long)local_268);
            pvVar36 = (void *)(lVar38 * uVar37 + (long)local_300);
            lVar29 = (long)iVar23 * uVar37;
            pvVar40 = (void *)((local_1c0 + lVar29) * local_1b8 + (long)local_2f8);
            pvVar16 = (void *)((local_1c0 * 2 + lVar29) * local_1b8 + (long)local_2f0);
            pvVar39 = (void *)((lVar29 + local_1c0 * 3) * local_1b8 + (long)local_318);
            do {
              lVar29 = 0;
              do {
                pfVar13 = (float *)((long)pvVar24 + lVar29);
                fVar50 = *pfVar13;
                fVar51 = pfVar13[1];
                fVar52 = pfVar13[2];
                fVar53 = pfVar13[3];
                pfVar13 = (float *)((long)pvVar36 + lVar29);
                fVar54 = pfVar13[1];
                fVar55 = pfVar13[2];
                fVar56 = pfVar13[3];
                *(float *)((long)d1 + lVar29) = *pfVar13 * fVar50 + *(float *)((long)d1 + lVar29);
                *(float *)((long)d1 + lVar29 + 4) =
                     fVar54 * fVar51 + *(float *)((long)d1 + lVar29 + 4);
                *(float *)((long)d1 + lVar29 + 8) =
                     fVar55 * fVar52 + *(float *)((long)d1 + lVar29 + 8);
                *(float *)((long)d1 + lVar29 + 0xc) =
                     fVar56 * fVar53 + *(float *)((long)d1 + lVar29 + 0xc);
                pfVar13 = (float *)((long)pvVar40 + lVar29);
                fVar54 = pfVar13[1];
                fVar55 = pfVar13[2];
                fVar56 = pfVar13[3];
                *(float *)((long)d2 + lVar29) = *pfVar13 * fVar50 + *(float *)((long)d2 + lVar29);
                *(float *)((long)d2 + lVar29 + 4) =
                     fVar54 * fVar51 + *(float *)((long)d2 + lVar29 + 4);
                *(float *)((long)d2 + lVar29 + 8) =
                     fVar55 * fVar52 + *(float *)((long)d2 + lVar29 + 8);
                *(float *)((long)d2 + lVar29 + 0xc) =
                     fVar56 * fVar53 + *(float *)((long)d2 + lVar29 + 0xc);
                pfVar13 = (float *)((long)pvVar16 + lVar29);
                fVar54 = pfVar13[1];
                fVar55 = pfVar13[2];
                fVar56 = pfVar13[3];
                *(float *)((long)d3 + lVar29) = *pfVar13 * fVar50 + *(float *)((long)d3 + lVar29);
                *(float *)((long)d3 + lVar29 + 4) =
                     fVar54 * fVar51 + *(float *)((long)d3 + lVar29 + 4);
                *(float *)((long)d3 + lVar29 + 8) =
                     fVar55 * fVar52 + *(float *)((long)d3 + lVar29 + 8);
                *(float *)((long)d3 + lVar29 + 0xc) =
                     fVar56 * fVar53 + *(float *)((long)d3 + lVar29 + 0xc);
                pfVar13 = (float *)((long)pvVar39 + lVar29);
                fVar54 = pfVar13[1];
                fVar55 = pfVar13[2];
                fVar56 = pfVar13[3];
                *(float *)((long)sum3 + lVar29) =
                     *pfVar13 * fVar50 + *(float *)((long)sum3 + lVar29);
                *(float *)((long)sum3 + lVar29 + 4) =
                     fVar54 * fVar51 + *(float *)((long)sum3 + lVar29 + 4);
                *(float *)((long)sum3 + lVar29 + 8) =
                     fVar55 * fVar52 + *(float *)((long)sum3 + lVar29 + 8);
                *(float *)((long)sum3 + lVar29 + 0xc) =
                     fVar56 * fVar53 + *(float *)((long)sum3 + lVar29 + 0xc);
                lVar29 = lVar29 + 0x10;
              } while (lVar29 != 0x40);
              uVar37 = uVar37 + 1;
              pvVar24 = (void *)((long)pvVar24 + local_228 * CONCAT44(uStack_254,local_258));
              pvVar36 = (void *)((long)pvVar36 + lVar38);
              pvVar40 = (void *)((long)pvVar40 + lVar38);
              pvVar16 = (void *)((long)pvVar16 + lVar38);
              pvVar39 = (void *)((long)pvVar39 + lVar38);
            } while (uVar37 != uVar17);
          }
          lVar29 = 0;
          do {
            *(undefined4 *)((long)pvVar31 + lVar29) = *(undefined4 *)((long)d1 + lVar29);
            *(undefined4 *)((long)pvVar35 + lVar29) = *(undefined4 *)((long)d2 + lVar29);
            *(undefined4 *)((long)pvVar45 + lVar29) = *(undefined4 *)((long)d3 + lVar29);
            *(undefined4 *)((long)pvVar34 + lVar29) = *(undefined4 *)((long)sum3 + lVar29);
            lVar29 = lVar29 + 4;
          } while (lVar29 != 0x40);
          local_390 = (void *)((long)local_390 + 1);
          pvVar34 = (void *)((long)pvVar34 + lVar28);
          pvVar45 = (void *)((long)pvVar45 + lVar28);
          pvVar35 = (void *)((long)pvVar35 + lVar28);
          pvVar31 = (void *)((long)pvVar31 + lVar28);
        } while (local_390 != (void *)local_190);
      }
      uVar30 = uVar30 + 1;
      local_2d0 = local_2d0 + lVar27;
      local_2d8 = local_2d8 + lVar27;
      local_2e0 = local_2e0 + lVar27;
      local_2e8 = local_2e8 + lVar27;
      local_300 = (void *)((long)local_300 + lVar27);
      local_2f8 = (void *)((long)local_2f8 + lVar27);
      local_2f0 = (void *)((long)local_2f0 + lVar27);
      local_318 = (void *)((long)local_318 + lVar27);
    } while (uVar30 != (uint)(_c >> 2));
  }
  if ((int)local_1d0 != _c) {
    local_1b8 = top_blob_tm.cstep *
                CONCAT44(top_blob_tm.elemsize._4_4_,(undefined4)top_blob_tm.elemsize);
    local_390 = local_198->data;
    sVar4 = local_198->elemsize;
    lVar14 = (long)local_198->w;
    iVar23 = (int)uVar17;
    local_1c0 = local_198->cstep * sVar4;
    local_328 = (void *)(local_1c0 * local_1d0 + (long)local_390);
    lVar21 = local_198->cstep * local_1d0;
    local_330 = (void *)((lVar21 + lVar14) * sVar4 + (long)local_390);
    local_2c8 = (void *)((lVar21 + lVar14 * 2) * sVar4 + (long)local_390);
    local_318 = (void *)((lVar14 * 3 + lVar21) * sVar4 + (long)local_390);
    lVar27 = sVar4 * lVar14 * 4;
    uVar30 = local_1d0;
    do {
      local_1d0 = uVar30;
      if (0 < (int)uVar19) {
        uVar30 = 0;
        do {
          uVar37 = 0;
          d1[0] = 0.0;
          d1[1] = 0.0;
          d1[2] = 0.0;
          d1[3] = 0.0;
          if (3 < (int)uVar17) {
            lVar28 = CONCAT44(uStack_254,local_258);
            lVar29 = (long)iStack_23c * uVar30;
            pvVar24 = (void *)(lVar29 * lVar28 + (long)local_268);
            lVar38 = local_228 * lVar28 * 4;
            pvVar16 = (void *)((local_228 + lVar29) * lVar28 + (long)local_268);
            pvVar39 = (void *)((lVar29 + local_228 * 2) * lVar28 + (long)local_268);
            pvVar36 = (void *)((local_228 * 3 + lVar29) * lVar28 + (long)local_268);
            pvVar45 = local_330;
            uVar48 = 0;
            pvVar31 = local_2c8;
            pvVar34 = local_318;
            pvVar35 = local_328;
            do {
              lVar28 = 0;
              do {
                pfVar13 = (float *)((long)pvVar24 + lVar28);
                pfVar1 = (float *)((long)pvVar35 + lVar28);
                fVar56 = *pfVar1 * *pfVar13 + *(float *)((long)d1 + lVar28);
                fVar57 = pfVar1[1] * pfVar13[1] + *(float *)((long)d1 + lVar28 + 4);
                fVar58 = pfVar1[2] * pfVar13[2] + *(float *)((long)d1 + lVar28 + 8);
                fVar63 = pfVar1[3] * pfVar13[3] + *(float *)((long)d1 + lVar28 + 0xc);
                *(float *)((long)d1 + lVar28) = fVar56;
                *(float *)((long)d1 + lVar28 + 4) = fVar57;
                *(float *)((long)d1 + lVar28 + 8) = fVar58;
                *(float *)((long)d1 + lVar28 + 0xc) = fVar63;
                pfVar13 = (float *)((long)pvVar16 + lVar28);
                pfVar1 = (float *)((long)pvVar45 + lVar28);
                fVar56 = *pfVar1 * *pfVar13 + fVar56;
                fVar57 = pfVar1[1] * pfVar13[1] + fVar57;
                fVar58 = pfVar1[2] * pfVar13[2] + fVar58;
                fVar63 = pfVar1[3] * pfVar13[3] + fVar63;
                *(float *)((long)d1 + lVar28) = fVar56;
                *(float *)((long)d1 + lVar28 + 4) = fVar57;
                *(float *)((long)d1 + lVar28 + 8) = fVar58;
                *(float *)((long)d1 + lVar28 + 0xc) = fVar63;
                pfVar13 = (float *)((long)pvVar39 + lVar28);
                pfVar1 = (float *)((long)pvVar31 + lVar28);
                fVar56 = *pfVar1 * *pfVar13 + fVar56;
                fVar57 = pfVar1[1] * pfVar13[1] + fVar57;
                fVar58 = pfVar1[2] * pfVar13[2] + fVar58;
                fVar63 = pfVar1[3] * pfVar13[3] + fVar63;
                *(float *)((long)d1 + lVar28) = fVar56;
                *(float *)((long)d1 + lVar28 + 4) = fVar57;
                *(float *)((long)d1 + lVar28 + 8) = fVar58;
                *(float *)((long)d1 + lVar28 + 0xc) = fVar63;
                pfVar1 = (float *)((long)pvVar36 + lVar28);
                fVar50 = pfVar1[1];
                fVar51 = pfVar1[2];
                fVar52 = pfVar1[3];
                pfVar13 = (float *)((long)pvVar34 + lVar28);
                fVar53 = pfVar13[1];
                fVar54 = pfVar13[2];
                fVar55 = pfVar13[3];
                *(float *)((long)d1 + lVar28) = *pfVar13 * *pfVar1 + fVar56;
                *(float *)((long)d1 + lVar28 + 4) = fVar53 * fVar50 + fVar57;
                *(float *)((long)d1 + lVar28 + 8) = fVar54 * fVar51 + fVar58;
                *(float *)((long)d1 + lVar28 + 0xc) = fVar55 * fVar52 + fVar63;
                lVar28 = lVar28 + 0x10;
              } while (lVar28 != 0x40);
              uVar37 = uVar48 + 4;
              lVar28 = uVar48 + 7;
              pvVar24 = (void *)((long)pvVar24 + lVar38);
              pvVar35 = (void *)((long)pvVar35 + lVar27);
              pvVar16 = (void *)((long)pvVar16 + lVar38);
              pvVar45 = (void *)((long)pvVar45 + lVar27);
              pvVar39 = (void *)((long)pvVar39 + lVar38);
              pvVar31 = (void *)((long)pvVar31 + lVar27);
              pvVar36 = (void *)((long)pvVar36 + lVar38);
              pvVar34 = (void *)((long)pvVar34 + lVar27);
              uVar48 = uVar37;
              uVar17 = local_1b0;
            } while (lVar28 < iVar23);
          }
          if ((int)uVar37 < (int)uVar44) {
            uVar37 = uVar37 & 0xffffffff;
            pvVar45 = (void *)((local_228 * uVar37 + (long)iStack_23c * uVar30) *
                               CONCAT44(uStack_254,local_258) + (long)local_268);
            pvVar31 = (void *)((lVar14 * uVar37 + lVar21) * sVar4 + (long)local_390);
            do {
              lVar28 = 0;
              do {
                pfVar13 = (float *)((long)pvVar45 + lVar28 * 4);
                fVar50 = pfVar13[1];
                fVar51 = pfVar13[2];
                fVar52 = pfVar13[3];
                pfVar1 = (float *)((long)pvVar31 + lVar28 * 4);
                fVar53 = pfVar1[1];
                fVar54 = pfVar1[2];
                fVar55 = pfVar1[3];
                d1[lVar28] = *pfVar1 * *pfVar13 + d1[lVar28];
                d1[lVar28 + 1] = fVar53 * fVar50 + d1[lVar28 + 1];
                d1[lVar28 + 2] = fVar54 * fVar51 + d1[lVar28 + 2];
                d1[lVar28 + 3] = fVar55 * fVar52 + d1[lVar28 + 3];
                lVar28 = lVar28 + 4;
              } while (lVar28 != 0x10);
              uVar37 = uVar37 + 1;
              pvVar45 = (void *)((long)pvVar45 + local_228 * CONCAT44(uStack_254,local_258));
              pvVar31 = (void *)((long)pvVar31 + sVar4 * lVar14);
            } while (uVar37 != uVar17);
          }
          pfVar13 = (float *)((long)top_blob_tm.data +
                             (long)top_blob_tm.w *
                             CONCAT44(top_blob_tm.elemsize._4_4_,(undefined4)top_blob_tm.elemsize) *
                             uVar30 + local_1b8 * local_1d0);
          pfVar13[0xc] = 0.0;
          pfVar13[0xd] = 0.0;
          pfVar13[0xe] = 0.0;
          pfVar13[0xf] = 0.0;
          pfVar13[8] = 0.0;
          pfVar13[9] = 0.0;
          pfVar13[10] = 0.0;
          pfVar13[0xb] = 0.0;
          pfVar13[4] = 0.0;
          pfVar13[5] = 0.0;
          pfVar13[6] = 0.0;
          pfVar13[7] = 0.0;
          *pfVar13 = d1[0];
          pfVar13[1] = d1[1];
          pfVar13[2] = d1[2];
          pfVar13[3] = d1[3];
          uVar30 = uVar30 + 1;
        } while (uVar30 != local_190);
      }
      local_328 = (void *)((long)local_328 + local_1c0);
      local_330 = (void *)((long)local_330 + local_1c0);
      local_2c8 = (void *)((long)local_2c8 + local_1c0);
      local_318 = (void *)((long)local_318 + local_1c0);
      local_390 = (void *)((long)local_390 + local_1c0);
      uVar30 = local_1d0 + 1;
    } while ((long)(local_1d0 + 1) < (long)uVar11);
  }
  d1[0] = 0.0;
  d1[1] = 0.0;
  d1[2] = 0.0;
  d1[3] = 0.0;
  piVar2 = (int *)CONCAT44(fStack_25c,uStack_260);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_248 == (Allocator *)0x0) {
        if (local_268 != (undefined1  [8])0x0) {
          free((void *)local_268);
        }
      }
      else {
        (*local_248->_vptr_Allocator[3])();
      }
    }
  }
  piVar2 = (int *)CONCAT44(d1[3],d1[2]);
  local_268._0_4_ = d1[0];
  local_268._4_4_ = d1[1];
  uStack_260 = d1[2];
  fStack_25c = d1[3];
  local_258 = 0;
  uStack_254 = 0;
  local_250 = 0;
  local_248 = (Allocator *)0x0;
  iStack_240 = 0;
  iStack_23c = 0;
  iStack_238 = 0;
  iStack_234 = 0;
  local_230 = 0;
  local_228 = 0;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if ((*piVar2 == 0) && (d1._0_8_ != 0)) {
      free((void *)d1._0_8_);
    }
  }
  local_348 = 0;
  d1[0] = 0.0;
  d1[1] = 0.0;
  d1[2] = 0.0;
  d1[3] = 0.0;
  local_378 = 0;
  uStack_374 = 0;
  local_368 = (Allocator *)0x0;
  iStack_35c = 0;
  local_358 = 0;
  if ((uVar18 == top_blob->w) && (local_1a0 == top_blob->h)) {
    if ((Mat *)d1 != top_blob) {
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      d1._0_8_ = top_blob->data;
      d1[2] = SUB84(top_blob->refcount,0);
      d1[3] = (float)((ulong)top_blob->refcount >> 0x20);
      local_378 = (undefined4)top_blob->elemsize;
      uStack_374 = (undefined4)(top_blob->elemsize >> 0x20);
      local_368 = top_blob->allocator;
      uVar9 = top_blob->w;
      uVar10 = top_blob->h;
      local_348 = top_blob->cstep;
      iStack_35c = uVar9;
      local_358 = uVar10;
    }
  }
  else {
    Mat::create((Mat *)d1,uVar18,local_1a0,_c,4,opt->workspace_allocator);
  }
  if (0 < _c) {
    uVar17 = 1;
    if (1 < (int)uVar47) {
      uVar17 = (ulong)uVar47;
    }
    uVar30 = 1;
    if (1 < (int)uVar41) {
      uVar30 = (ulong)uVar41;
    }
    lVar27 = (long)top_blob_tm.w *
             CONCAT44(top_blob_tm.elemsize._4_4_,(undefined4)top_blob_tm.elemsize);
    uVar37 = 0;
    pvVar45 = top_blob_tm.data;
    do {
      if (pvVar3 == (void *)0x0) {
        fVar50 = 0.0;
      }
      else {
        fVar50 = *(float *)((long)pvVar3 + uVar37 * 4);
      }
      if (0 < (int)local_1c8) {
        lVar14 = (long)iStack_35c * CONCAT44(uStack_374,local_378);
        uVar44 = 0;
        uVar48 = 0;
        do {
          if (0 < (int)local_1a8) {
            pfVar13 = (float *)((ulong)uVar44 * lVar27 + (long)pvVar45);
            puVar42 = (undefined8 *)
                      (local_348 * CONCAT44(uStack_374,local_378) * uVar37 + d1._0_8_ +
                      uVar48 * lVar14 * 2);
            uVar26 = uVar17;
            do {
              fVar51 = pfVar13[3];
              fVar52 = pfVar13[7];
              fVar53 = pfVar13[0xb];
              fVar54 = pfVar13[0xf];
              fVar57 = pfVar13[1] + pfVar13[5] + pfVar13[9];
              fVar58 = pfVar13[2] + pfVar13[6] + pfVar13[10];
              fVar55 = (pfVar13[5] - pfVar13[9]) + pfVar13[0xd];
              fVar56 = (pfVar13[6] - pfVar13[10]) + pfVar13[0xe];
              *puVar42 = CONCAT44(fVar55 + fVar56 +
                                  (pfVar13[4] - pfVar13[8]) + pfVar13[0xc] + fVar50,
                                  fVar57 + fVar58 + *pfVar13 + pfVar13[4] + pfVar13[8] + fVar50);
              *(ulong *)((long)puVar42 + lVar14) =
                   CONCAT44(((fVar55 + fVar50) - fVar56) + (fVar52 - fVar53) + fVar54,
                            ((fVar57 + fVar50) - fVar58) + fVar51 + fVar52 + fVar53);
              puVar42 = puVar42 + 1;
              pfVar13 = (float *)((long)pfVar13 + lVar27);
              uVar26 = uVar26 - 1;
            } while (uVar26 != 0);
          }
          uVar48 = uVar48 + 1;
          uVar44 = uVar44 + uVar47;
        } while (uVar48 != uVar30);
      }
      uVar37 = uVar37 + 1;
      pvVar45 = (void *)((long)pvVar45 +
                        top_blob_tm.cstep *
                        CONCAT44(top_blob_tm.elemsize._4_4_,(undefined4)top_blob_tm.elemsize));
    } while (uVar37 != uVar11);
  }
  copy_cut_border((Mat *)d1,top_blob,0,local_358 - top_blob->h,0,iStack_35c - top_blob->w,opt);
  piVar2 = (int *)CONCAT44(d1[3],d1[2]);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_368 == (Allocator *)0x0) {
        if (d1._0_8_ != 0) {
          free((void *)d1._0_8_);
        }
      }
      else {
        (*local_368->_vptr_Allocator[3])();
      }
    }
  }
  piVar2 = (int *)CONCAT44(top_blob_tm.refcount._4_4_,top_blob_tm.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (top_blob_tm.allocator == (Allocator *)0x0) {
        if (top_blob_tm.data != (void *)0x0) {
          free(top_blob_tm.data);
        }
      }
      else {
        (*(top_blob_tm.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar2 = (int *)CONCAT44(fStack_25c,uStack_260);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_248 == (Allocator *)0x0) {
        if (local_268 != (undefined1  [8])0x0) {
          free((void *)local_268);
        }
      }
      else {
        (*local_248->_vptr_Allocator[3])();
      }
    }
  }
  local_228 = 0;
  local_268 = (undefined1  [8])0x0;
  uStack_260 = 0.0;
  fStack_25c = 0.0;
  local_258 = 0;
  uStack_254 = 0;
  local_250 = 0;
  iStack_240 = 0;
  iStack_23c = 0;
  iStack_238 = 0;
  iStack_234 = 0;
  local_230 = 0;
  piVar2 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_218.allocator == (Allocator *)0x0) {
        if (local_218.data != (void *)0x0) {
          free(local_218.data);
        }
      }
      else {
        (*(local_218.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    const float* bias = _bias;

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(4 * 4, tiles, inch, 4u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {1.0f,  0.0f, -1.0f,  0.0f},
        //     {0.0f,  1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  0.00f, 1.0f}
        // };
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < inch; q++)
        {
            const float* img = bottom_blob_bordered.channel(q);
            float* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const float* r0 = img + w * j * 2;
                const float* r1 = r0 + w;
                const float* r2 = r1 + w;
                const float* r3 = r2 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
#if __AVX__
                    __m128 _d0, _d1, _d2, _d3;
                    __m128 _w0, _w1, _w2, _w3;

                    // load
                    _d0 = _mm_loadu_ps(r0);
                    _d1 = _mm_loadu_ps(r1);
                    _d2 = _mm_loadu_ps(r2);
                    _d3 = _mm_loadu_ps(r3);

                    // w = B_t * d
                    _w0 = _mm_sub_ps(_d0, _d2);
                    _w1 = _mm_add_ps(_d1, _d2);
                    _w2 = _mm_sub_ps(_d2, _d1);
                    _w3 = _mm_sub_ps(_d3, _d1);

                    // transpose d to d_t
                    _MM_TRANSPOSE4_PS(_w0, _w1, _w2, _w3);

                    // d = B_t * d_t
                    _d0 = _mm_sub_ps(_w0, _w2);
                    _d1 = _mm_add_ps(_w1, _w2);
                    _d2 = _mm_sub_ps(_w2, _w1);
                    _d3 = _mm_sub_ps(_w3, _w1);

                    // save to out_tm
                    _mm_storeu_ps(out_tm0, _d0);
                    _mm_storeu_ps(out_tm0 + 4, _d1);
                    _mm_storeu_ps(out_tm0 + 8, _d2);
                    _mm_storeu_ps(out_tm0 + 12, _d3);
#else
                    float d0[4], d1[4], d2[4], d3[4];
                    float w0[4], w1[4], w2[4], w3[4];
                    float t0[4], t1[4], t2[4], t3[4];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = d0[n] - d2[n];
                        w1[n] = d1[n] + d2[n];
                        w2[n] = d2[n] - d1[n];
                        w3[n] = d3[n] - d1[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0] = w0[0];
                        t1[0] = w0[1];
                        t2[0] = w0[2];
                        t3[0] = w0[3];
                        t0[1] = w1[0];
                        t1[1] = w1[1];
                        t2[1] = w1[2];
                        t3[1] = w1[3];
                        t0[2] = w2[0];
                        t1[2] = w2[1];
                        t2[2] = w2[2];
                        t3[2] = w2[3];
                        t0[3] = w3[0];
                        t1[3] = w3[1];
                        t2[3] = w3[2];
                        t3[3] = w3[3];
                    }
                    // d = B_t * d_t
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = t0[n] - t2[n];
                        d1[n] = t1[n] + t2[n];
                        d2[n] = t2[n] - t1[n];
                        d3[n] = t3[n] - t1[n];
                    }
                    // save to out_tm
                    for (int n = 0; n < 4; n++)
                    {
                        out_tm0[n] = d0[n];
                        out_tm0[n + 4] = d1[n];
                        out_tm0[n + 8] = d2[n];
                        out_tm0[n + 12] = d3[n];
                    }
#endif
                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;

                    out_tm0 += 16;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        top_blob_tm.create(16, tiles, outch, 4u, opt.workspace_allocator);

        int nn_outch = outch >> 2;
        int remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            Mat out0_tm = top_blob_tm.channel(p);
            Mat out1_tm = top_blob_tm.channel(p + 1);
            Mat out2_tm = top_blob_tm.channel(p + 2);
            Mat out3_tm = top_blob_tm.channel(p + 3);

            const Mat kernel0_tm = kernel_tm.channel(p);
            const Mat kernel1_tm = kernel_tm.channel(p + 1);
            const Mat kernel2_tm = kernel_tm.channel(p + 2);
            const Mat kernel3_tm = kernel_tm.channel(p + 3);

            for (int i = 0; i < tiles; i++)
            {
                float* output0_tm = out0_tm.row(i);
                float* output1_tm = out1_tm.row(i);
                float* output2_tm = out2_tm.row(i);
                float* output3_tm = out3_tm.row(i);

#if __AVX__
                float zero_val = 0.f;

                __m256 _sum0 = _mm256_broadcast_ss(&zero_val);
                __m256 _sum0n = _mm256_broadcast_ss(&zero_val);
                __m256 _sum1 = _mm256_broadcast_ss(&zero_val);
                __m256 _sum1n = _mm256_broadcast_ss(&zero_val);
                __m256 _sum2 = _mm256_broadcast_ss(&zero_val);
                __m256 _sum2n = _mm256_broadcast_ss(&zero_val);
                __m256 _sum3 = _mm256_broadcast_ss(&zero_val);
                __m256 _sum3n = _mm256_broadcast_ss(&zero_val);

                int q = 0;

                for (; q + 3 < inch; q += 4)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);
                    const float* r1 = bottom_blob_tm.channel(q + 1).row(i);
                    const float* r2 = bottom_blob_tm.channel(q + 2).row(i);
                    const float* r3 = bottom_blob_tm.channel(q + 3).row(i);

                    const float* k0 = kernel0_tm.row(q);
                    const float* k1 = kernel1_tm.row(q);
                    const float* k2 = kernel2_tm.row(q);
                    const float* k3 = kernel3_tm.row(q);

                    __m256 _r0 = _mm256_loadu_ps(r0);
                    __m256 _r0n = _mm256_loadu_ps(r0 + 8);
                    // k0
                    __m256 _k0 = _mm256_loadu_ps(k0);
                    __m256 _k0n = _mm256_loadu_ps(k0 + 8);
                    __m256 _k1 = _mm256_loadu_ps(k1);
                    __m256 _k1n = _mm256_loadu_ps(k1 + 8);
                    __m256 _k2 = _mm256_loadu_ps(k2);
                    __m256 _k2n = _mm256_loadu_ps(k2 + 8);
                    __m256 _k3 = _mm256_loadu_ps(k3);
                    __m256 _k3n = _mm256_loadu_ps(k3 + 8);
                    _sum0 = _mm256_comp_fmadd_ps(_r0, _k0, _sum0);
                    _sum0n = _mm256_comp_fmadd_ps(_r0n, _k0n, _sum0n);
                    _sum1 = _mm256_comp_fmadd_ps(_r0, _k1, _sum1);
                    _sum1n = _mm256_comp_fmadd_ps(_r0n, _k1n, _sum1n);
                    _sum2 = _mm256_comp_fmadd_ps(_r0, _k2, _sum2);
                    _sum2n = _mm256_comp_fmadd_ps(_r0n, _k2n, _sum2n);
                    _sum3 = _mm256_comp_fmadd_ps(_r0, _k3, _sum3);
                    _sum3n = _mm256_comp_fmadd_ps(_r0n, _k3n, _sum3n);

                    // k1
                    _r0 = _mm256_loadu_ps(r1);
                    _r0n = _mm256_loadu_ps(r1 + 8);
                    _k0 = _mm256_loadu_ps(k0 + 16);
                    _k0n = _mm256_loadu_ps(k0 + 24);
                    _k1 = _mm256_loadu_ps(k1 + 16);
                    _k1n = _mm256_loadu_ps(k1 + 24);
                    _k2 = _mm256_loadu_ps(k2 + 16);
                    _k2n = _mm256_loadu_ps(k2 + 24);
                    _k3 = _mm256_loadu_ps(k3 + 16);
                    _k3n = _mm256_loadu_ps(k3 + 24);
                    _sum0 = _mm256_comp_fmadd_ps(_r0, _k0, _sum0);
                    _sum0n = _mm256_comp_fmadd_ps(_r0n, _k0n, _sum0n);
                    _sum1 = _mm256_comp_fmadd_ps(_r0, _k1, _sum1);
                    _sum1n = _mm256_comp_fmadd_ps(_r0n, _k1n, _sum1n);
                    _sum2 = _mm256_comp_fmadd_ps(_r0, _k2, _sum2);
                    _sum2n = _mm256_comp_fmadd_ps(_r0n, _k2n, _sum2n);
                    _sum3 = _mm256_comp_fmadd_ps(_r0, _k3, _sum3);
                    _sum3n = _mm256_comp_fmadd_ps(_r0n, _k3n, _sum3n);
                    // k2
                    _r0 = _mm256_loadu_ps(r2);
                    _r0n = _mm256_loadu_ps(r2 + 8);
                    _k0 = _mm256_loadu_ps(k0 + 32);
                    _k0n = _mm256_loadu_ps(k0 + 40);
                    _k1 = _mm256_loadu_ps(k1 + 32);
                    _k1n = _mm256_loadu_ps(k1 + 40);
                    _k2 = _mm256_loadu_ps(k2 + 32);
                    _k2n = _mm256_loadu_ps(k2 + 40);
                    _k3 = _mm256_loadu_ps(k3 + 32);
                    _k3n = _mm256_loadu_ps(k3 + 40);
                    _sum0 = _mm256_comp_fmadd_ps(_r0, _k0, _sum0);
                    _sum0n = _mm256_comp_fmadd_ps(_r0n, _k0n, _sum0n);
                    _sum1 = _mm256_comp_fmadd_ps(_r0, _k1, _sum1);
                    _sum1n = _mm256_comp_fmadd_ps(_r0n, _k1n, _sum1n);
                    _sum2 = _mm256_comp_fmadd_ps(_r0, _k2, _sum2);
                    _sum2n = _mm256_comp_fmadd_ps(_r0n, _k2n, _sum2n);
                    _sum3 = _mm256_comp_fmadd_ps(_r0, _k3, _sum3);
                    _sum3n = _mm256_comp_fmadd_ps(_r0n, _k3n, _sum3n);
                    // k3
                    _r0 = _mm256_loadu_ps(r3);
                    _r0n = _mm256_loadu_ps(r3 + 8);
                    _k0 = _mm256_loadu_ps(k0 + 48);
                    _k0n = _mm256_loadu_ps(k0 + 56);
                    _k1 = _mm256_loadu_ps(k1 + 48);
                    _k1n = _mm256_loadu_ps(k1 + 56);
                    _k2 = _mm256_loadu_ps(k2 + 48);
                    _k2n = _mm256_loadu_ps(k2 + 56);
                    _k3 = _mm256_loadu_ps(k3 + 48);
                    _k3n = _mm256_loadu_ps(k3 + 56);
                    _sum0 = _mm256_comp_fmadd_ps(_r0, _k0, _sum0);
                    _sum0n = _mm256_comp_fmadd_ps(_r0n, _k0n, _sum0n);
                    _sum1 = _mm256_comp_fmadd_ps(_r0, _k1, _sum1);
                    _sum1n = _mm256_comp_fmadd_ps(_r0n, _k1n, _sum1n);
                    _sum2 = _mm256_comp_fmadd_ps(_r0, _k2, _sum2);
                    _sum2n = _mm256_comp_fmadd_ps(_r0n, _k2n, _sum2n);
                    _sum3 = _mm256_comp_fmadd_ps(_r0, _k3, _sum3);
                    _sum3n = _mm256_comp_fmadd_ps(_r0n, _k3n, _sum3n);
                }

                for (; q < inch; q++)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);

                    const float* k0 = kernel0_tm.row(q);
                    const float* k1 = kernel1_tm.row(q);
                    const float* k2 = kernel2_tm.row(q);
                    const float* k3 = kernel3_tm.row(q);

                    __m256 _r0 = _mm256_loadu_ps(r0);
                    __m256 _r0n = _mm256_loadu_ps(r0 + 8);
                    __m256 _k0 = _mm256_loadu_ps(k0);
                    __m256 _k0n = _mm256_loadu_ps(k0 + 8);
                    __m256 _k1 = _mm256_loadu_ps(k1);
                    __m256 _k1n = _mm256_loadu_ps(k1 + 8);
                    __m256 _k2 = _mm256_loadu_ps(k2);
                    __m256 _k2n = _mm256_loadu_ps(k2 + 8);
                    __m256 _k3 = _mm256_loadu_ps(k3);
                    __m256 _k3n = _mm256_loadu_ps(k3 + 8);

                    _sum0 = _mm256_comp_fmadd_ps(_r0, _k0, _sum0);
                    _sum0n = _mm256_comp_fmadd_ps(_r0n, _k0n, _sum0n);
                    _sum1 = _mm256_comp_fmadd_ps(_r0, _k1, _sum1);
                    _sum1n = _mm256_comp_fmadd_ps(_r0n, _k1n, _sum1n);
                    _sum2 = _mm256_comp_fmadd_ps(_r0, _k2, _sum2);
                    _sum2n = _mm256_comp_fmadd_ps(_r0n, _k2n, _sum2n);
                    _sum3 = _mm256_comp_fmadd_ps(_r0, _k3, _sum3);
                    _sum3n = _mm256_comp_fmadd_ps(_r0n, _k3n, _sum3n);
                }

                _mm256_storeu_ps(output0_tm, _sum0);
                _mm256_storeu_ps(output0_tm + 8, _sum0n);
                _mm256_storeu_ps(output1_tm, _sum1);
                _mm256_storeu_ps(output1_tm + 8, _sum1n);
                _mm256_storeu_ps(output2_tm, _sum2);
                _mm256_storeu_ps(output2_tm + 8, _sum2n);
                _mm256_storeu_ps(output3_tm, _sum3);
                _mm256_storeu_ps(output3_tm + 8, _sum3n);
#else
                float sum0[16] = {0.0f};
                float sum1[16] = {0.0f};
                float sum2[16] = {0.0f};
                float sum3[16] = {0.0f};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);
                    const float* r1 = bottom_blob_tm.channel(q + 1).row(i);
                    const float* r2 = bottom_blob_tm.channel(q + 2).row(i);
                    const float* r3 = bottom_blob_tm.channel(q + 3).row(i);

                    const float* k0 = kernel0_tm.row(q);
                    const float* k1 = kernel1_tm.row(q);
                    const float* k2 = kernel2_tm.row(q);
                    const float* k3 = kernel3_tm.row(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += r0[n] * k0[n];
                        k0 += 16;
                        sum0[n] += r1[n] * k0[n];
                        k0 += 16;
                        sum0[n] += r2[n] * k0[n];
                        k0 += 16;
                        sum0[n] += r3[n] * k0[n];
                        k0 -= 16 * 3;

                        sum1[n] += r0[n] * k1[n];
                        k1 += 16;
                        sum1[n] += r1[n] * k1[n];
                        k1 += 16;
                        sum1[n] += r2[n] * k1[n];
                        k1 += 16;
                        sum1[n] += r3[n] * k1[n];
                        k1 -= 16 * 3;

                        sum2[n] += r0[n] * k2[n];
                        k2 += 16;
                        sum2[n] += r1[n] * k2[n];
                        k2 += 16;
                        sum2[n] += r2[n] * k2[n];
                        k2 += 16;
                        sum2[n] += r3[n] * k2[n];
                        k2 -= 16 * 3;

                        sum3[n] += r0[n] * k3[n];
                        k3 += 16;
                        sum3[n] += r1[n] * k3[n];
                        k3 += 16;
                        sum3[n] += r2[n] * k3[n];
                        k3 += 16;
                        sum3[n] += r3[n] * k3[n];
                        k3 -= 16 * 3;
                    }
                }

                for (; q < inch; q++)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);

                    const float* k0 = kernel0_tm.row(q);
                    const float* k1 = kernel1_tm.row(q);
                    const float* k2 = kernel2_tm.row(q);
                    const float* k3 = kernel3_tm.row(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += r0[n] * k0[n];
                        sum1[n] += r0[n] * k1[n];
                        sum2[n] += r0[n] * k2[n];
                        sum3[n] += r0[n] * k3[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                    output1_tm[n] = sum1[n];
                    output2_tm[n] = sum2[n];
                    output3_tm[n] = sum3[n];
                }
#endif
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i = 0; i < tiles; i++)
            {
                float* output0_tm = out0_tm.row(i);

                float sum0[16] = {0.0f};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);
                    const float* r1 = bottom_blob_tm.channel(q + 1).row(i);
                    const float* r2 = bottom_blob_tm.channel(q + 2).row(i);
                    const float* r3 = bottom_blob_tm.channel(q + 3).row(i);

                    const float* k0 = kernel0_tm.row(q);
                    const float* k1 = kernel0_tm.row(q + 1);
                    const float* k2 = kernel0_tm.row(q + 2);
                    const float* k3 = kernel0_tm.row(q + 3);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += r0[n] * k0[n];
                        sum0[n] += r1[n] * k1[n];
                        sum0[n] += r2[n] * k2[n];
                        sum0[n] += r3[n] * k3[n];
                    }
                }

                for (; q < inch; q++)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);
                    const float* k0 = kernel0_tm.row(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += r0[n] * k0[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    }
    {
        // AT
        // const float itm[2][4] = {
        //     {1.0f,  1.0f,  1.0f,  0.0f},
        //     {0.0f,  1.0f, -1.0f,  1.0f}
        // };

        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            const float bias0 = bias ? bias[p] : 0.f;

            for (int j = 0; j < nColBlocks; j++)
            {
                float* outRow0 = out.row(j * 2);
                float* outRow1 = out.row(j * 2 + 1);

                for (int i = 0; i < nRowBlocks; i++)
                {
                    float* out_tile = out_tm.row(j * nRowBlocks + i);

                    float s0[4], s1[4], s2[4], s3[4];
                    float w0[4], w1[4];
                    float d0[2], d1[2], d2[2], d3[2];
                    float o0[2], o1[2];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n + 4];
                        s2[n] = out_tile[n + 8];
                        s3[n] = out_tile[n + 12];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n];
                        w1[n] = s1[n] - s2[n] + s3[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0];
                        d0[1] = w1[0];
                        d1[0] = w0[1];
                        d1[1] = w1[1];
                        d2[0] = w0[2];
                        d2[1] = w1[2];
                        d3[0] = w0[3];
                        d3[1] = w1[3];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 2; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n] + bias0;
                        o1[n] = d1[n] - d2[n] + d3[n] + bias0;
                    }
                    // save to top blob tm
                    outRow0[0] = o0[0];
                    outRow0[1] = o0[1];
                    outRow1[0] = o1[0];
                    outRow1[1] = o1[1];

                    outRow0 += 2;
                    outRow1 += 2;
                }
            }
        }
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}